

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  uint flags;
  StartInfo *info;
  bool bVar7;
  LogMessage local_1a0;
  
  pcVar2 = (params->text).ptr_;
  pcVar3 = (params->context).ptr_;
  if (pcVar2 < pcVar3) {
LAB_00126bc7:
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x64e,3
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Text is not inside context.",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
    params->start = (State *)0x1;
    return true;
  }
  pbVar6 = (byte *)(pcVar2 + (params->text).length_);
  if (pcVar3 + (params->context).length_ < pbVar6) goto LAB_00126bc7;
  if (params->run_forward == true) {
    if (pcVar2 == pcVar3) {
LAB_00126c39:
      flags = 5;
      uVar5 = 0;
      goto LAB_00126c74;
    }
    bVar1 = pcVar2[-1];
  }
  else {
    if (pbVar6 == (byte *)(pcVar3 + (params->context).length_)) goto LAB_00126c39;
    bVar1 = *pbVar6;
  }
  if (bVar1 == 10) {
    flags = 1;
    uVar5 = 2;
  }
  else {
    bVar4 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
    bVar7 = (byte)(bVar1 - 0x30) < 10;
    uVar5 = (uint)((bVar1 != 0x5f && !bVar7) && !bVar4) * 2 + 4;
    flags = (uint)((bVar1 == 0x5f || bVar7) || bVar4) << 0xd;
  }
LAB_00126c74:
  if ((params->anchored != false) || (this->prog_->anchor_start_ == true)) {
    uVar5 = uVar5 | 1;
  }
  info = (StartInfo *)((long)&this->start_[0].start + (ulong)(uVar5 << 4));
  bVar4 = AnalyzeSearchHelper(this,params,info,flags);
  if (!bVar4) {
    ResetCache(this,params->cache_lock);
    bVar4 = AnalyzeSearchHelper(this,params,info,flags);
    if (!bVar4) {
      LogMessage::LogMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x67d
                 ,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0.str_,"Failed to analyze start state.",0x1e);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
      params->failed = true;
      return false;
    }
  }
  params->start = info->start;
  params->firstbyte =
       *(int *)((long)&this->start_[0].firstbyte.super___atomic_base<int>._M_i + (ulong)(uVar5 << 4)
               );
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "Text is not inside context.";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint flags;
  if (params->run_forward) {
    if (text.begin() == context.begin()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.begin()[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.begin()[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (text.end() == context.end()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.end()[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.end()[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored || prog_->anchor_start())
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      LOG(DFATAL) << "Failed to analyze start state.";
      params->failed = true;
      return false;
    }
  }

  if (DebugDFA)
    fprintf(stderr, "anchored=%d fwd=%d flags=%#x state=%s firstbyte=%d\n",
            params->anchored, params->run_forward, flags,
            DumpState(info->start).c_str(), info->firstbyte.load());

  params->start = info->start;
  params->firstbyte = info->firstbyte.load(std::memory_order_acquire);

  return true;
}